

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::SetVertex(ON_Mesh *this,int vertex_index,ON_3dPoint *vertex_location)

{
  uint uVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  ON_3fPoint *pOVar4;
  uint i;
  ON_3fPoint local_3c;
  
  uVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if ((uint)vertex_index <= uVar1 && -1 < vertex_index) {
    if (uVar1 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
      if ((uint)vertex_index < uVar1) {
        pOVar2 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
        pOVar2[(uint)vertex_index].z = vertex_location->z;
        dVar3 = vertex_location->y;
        pOVar2 = pOVar2 + (uint)vertex_index;
        pOVar2->x = vertex_location->x;
        pOVar2->y = dVar3;
      }
      else {
        ON_SimpleArray<ON_3dPoint>::Append
                  (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,vertex_location);
      }
    }
    if (uVar1 == (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) {
      if ((uint)vertex_index < uVar1) {
        ON_3fPoint::operator=
                  ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + (uint)vertex_index,
                   vertex_location);
      }
      else {
        ON_3fPoint::ON_3fPoint(&local_3c,vertex_location);
        pOVar4 = ON_SimpleArray<ON_3fPoint>::AppendNew
                           (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        pOVar4->x = local_3c.x;
        pOVar4->y = local_3c.y;
        pOVar4->z = local_3c.z;
      }
    }
  }
  return (uint)vertex_index <= uVar1 && -1 < vertex_index;
}

Assistant:

bool
ON_MeshFace::IsValid(int mesh_vertex_count) const
{
  return (vi[0] >= 0 && vi[0] < mesh_vertex_count
    && vi[1] >= 0 && vi[1] < mesh_vertex_count
    && vi[2] >= 0 && vi[2] < mesh_vertex_count
    && vi[3] >= 0 && vi[3] < mesh_vertex_count
    && vi[0] != vi[1] && vi[1] != vi[2] && vi[2] != vi[0]
    && (vi[2] == vi[3] || (vi[0] != vi[3] && vi[1] != vi[3])));
}